

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::utp_socket_impl::write_sack(utp_socket_impl *this,uint8_t *buf,int size)

{
  byte bVar1;
  uint idx;
  packet *ppVar2;
  int local_30;
  int i;
  int mask;
  uint8_t *end;
  int ack_nr;
  int size_local;
  uint8_t *buf_local;
  utp_socket_impl *this_local;
  
  end._0_4_ = this->m_ack_nr + 2 & 0xffff;
  for (_ack_nr = buf; _ack_nr != buf + size; _ack_nr = _ack_nr + 1) {
    *_ack_nr = 0;
    bVar1 = 1;
    for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
      idx = numeric_cast<unsigned_int,int,void>((uint)end);
      ppVar2 = packet_buffer::at(&this->m_inbuf,idx);
      if (ppVar2 != (packet *)0x0) {
        *_ack_nr = *_ack_nr | bVar1;
      }
      bVar1 = bVar1 << 1;
      end._0_4_ = (uint)end + 1 & 0xffff;
    }
  }
  return;
}

Assistant:

void utp_socket_impl::write_sack(std::uint8_t* buf, int const size) const
{
	INVARIANT_CHECK;

	TORRENT_ASSERT(m_inbuf.size());
	int ack_nr = (m_ack_nr + 2) & ACK_MASK;
	std::uint8_t* end = buf + size;

	for (; buf != end; ++buf)
	{
		*buf = 0;
		int mask = 1;
		for (int i = 0; i < 8; ++i)
		{
			if (m_inbuf.at(aux::numeric_cast<packet_buffer::index_type>(ack_nr))) *buf |= mask;
			mask <<= 1;
			ack_nr = (ack_nr + 1) & ACK_MASK;
		}
	}
}